

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcInse.c
# Opt level: O2

Vec_Int_t *
Gia_ManInseTest(Gia_Man_t *p,Vec_Int_t *vInit0,int nFrames,int nWords,int nTimeOut,int fSim,
               int fVerbose)

{
  Vec_Int_t *p_00;
  Vec_Int_t *pVVar1;
  
  p_00 = Vec_IntAlloc(0);
  Vec_IntFill(p_00,p->nRegs,0);
  pVVar1 = Gia_ManInsePerform(p,p_00,nFrames,nWords,fVerbose);
  if (p_00 != vInit0) {
    free(p_00->pArray);
    free(p_00);
  }
  return pVVar1;
}

Assistant:

Vec_Int_t * Gia_ManInseTest( Gia_Man_t * p, Vec_Int_t * vInit0, int nFrames, int nWords, int nTimeOut, int fSim, int fVerbose )
{
    Vec_Int_t * vRes, * vInit;
    vInit = Vec_IntAlloc(0); Vec_IntFill( vInit, Gia_ManRegNum(p), 0 );
    vRes = Gia_ManInsePerform( p, vInit, nFrames, nWords, fVerbose );
    if ( vInit != vInit0 )
        Vec_IntFree( vInit );
    return vRes;
}